

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O0

void mouseMotionCallback(GLFWwindow *param_1,double x,double y)

{
  double dVar1;
  double dVar2;
  ImGuiIO *pIVar3;
  ImGuiIO *io;
  double y_local;
  double x_local;
  GLFWwindow *param_2_local;
  
  pIVar3 = ImGui::GetIO();
  dVar1 = x;
  dVar2 = y;
  if ((pIVar3->WantCaptureMouse & 1U) != 0) {
    dVar1 = mouseMotionCallback::x0;
    dVar2 = mouseMotionCallback::y0;
  }
  mouseMotionCallback::y0 = dVar2;
  mouseMotionCallback::x0 = dVar1;
  return;
}

Assistant:

void mouseMotionCallback(GLFWwindow* /*window*/, double x, double y)
{
    static double x0 = 0, y0 = 0;

    ImGuiIO& io = ImGui::GetIO();
    if (io.WantCaptureMouse)
        return;

    x0 = x;
    y0 = y;
}